

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_rp_init_target(nk_rp_context *context,int width,int height,nk_rp_node *nodes,int num_nodes)

{
  int local_28;
  int i;
  int num_nodes_local;
  nk_rp_node *nodes_local;
  int height_local;
  int width_local;
  nk_rp_context *context_local;
  
  if ((width < 0x10000) && (height < 0x10000)) {
    for (local_28 = 0; local_28 < num_nodes + -1; local_28 = local_28 + 1) {
      nodes[local_28].next = nodes + (local_28 + 1);
    }
    nodes[local_28].next = (nk_rp_node *)0x0;
    context->init_mode = 1;
    context->heuristic = 0;
    context->free_head = nodes;
    context->active_head = context->extra;
    context->width = width;
    context->height = height;
    context->num_nodes = num_nodes;
    nk_rp_setup_allow_out_of_mem(context,0);
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = context->extra + 1;
    context->extra[1].x = (nk_rp_coord)width;
    context->extra[1].y = 0xffff;
    context->extra[1].next = (nk_rp_node *)0x0;
    return;
  }
  __assert_fail("width <= 0xffff && height <= 0xffff",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x2986,
                "void nk_rp_init_target(struct nk_rp_context *, int, int, struct nk_rp_node *, int)"
               );
}

Assistant:

NK_INTERN void
nk_rp_init_target(struct nk_rp_context *context, int width, int height,
    struct nk_rp_node *nodes, int num_nodes)
{
    int i;
#ifndef STBRP_LARGE_RECTS
    NK_ASSERT(width <= 0xffff && height <= 0xffff);
#endif

    for (i=0; i < num_nodes-1; ++i)
        nodes[i].next = &nodes[i+1];
    nodes[i].next = 0;
    context->init_mode = NK_RP__INIT_skyline;
    context->heuristic = NK_RP_HEURISTIC_Skyline_default;
    context->free_head = &nodes[0];
    context->active_head = &context->extra[0];
    context->width = width;
    context->height = height;
    context->num_nodes = num_nodes;
    nk_rp_setup_allow_out_of_mem(context, 0);

    /* node 0 is the full width, node 1 is the sentinel (lets us not store width explicitly) */
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = &context->extra[1];
    context->extra[1].x = (nk_rp_coord) width;
    context->extra[1].y = 65535;
    context->extra[1].next = 0;
}